

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O3

void __thiscall QSyntaxHighlighter::rehighlight(QSyntaxHighlighter *this)

{
  bool bVar1;
  QSyntaxHighlighterPrivate *this_00;
  Data *pDVar2;
  int from;
  int iVar3;
  QObject *document;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QTextCursor local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSyntaxHighlighterPrivate **)&this->field_0x8;
  pDVar2 = (this_00->doc).wp.d;
  if (((pDVar2 != (Data *)0x0) && ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i != 0))
     && (document = (this_00->doc).wp.value, document != (QObject *)0x0)) {
    local_30.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    if ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0) {
      document = (QObject *)0x0;
    }
    QTextCursor::QTextCursor(&local_30,(QTextDocument *)document);
    bVar1 = this_00->inReformatBlocks;
    this_00->inReformatBlocks = true;
    QTextCursor::beginEditBlock(&local_30);
    from = QTextCursor::position(&local_30);
    QTextCursor::movePosition(&local_30,End,MoveAnchor,1);
    iVar3 = QTextCursor::position(&local_30);
    QSyntaxHighlighterPrivate::reformatBlocks(this_00,from,0,iVar3 - from);
    QTextCursor::endEditBlock(&local_30);
    this_00->inReformatBlocks = bVar1;
    this_00->rehighlightPending = false;
    QTextCursor::~QTextCursor(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighter::rehighlight()
{
    Q_D(QSyntaxHighlighter);
    if (!d->doc)
        return;

    QTextCursor cursor(d->doc);
    d->rehighlight(cursor, QTextCursor::End);
    d->rehighlightPending = false; // user manually did a full rehighlight
}